

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

Vec2 __thiscall
tcu::computeOpenGLLodBoundsFromDerivates
          (tcu *this,float dudx,float dvdx,float dwdx,float dudy,float dvdy,float dwdy,
          LodPrecision *prec)

{
  Vec2 VVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  float lodErr;
  float maxLod;
  float minLod;
  float maxDErr;
  float minDErr;
  float maxDBound;
  float minDBound;
  float mw;
  float mv;
  float mu;
  LodPrecision *prec_local;
  float dwdy_local;
  float dvdy_local;
  float dudy_local;
  float dwdx_local;
  float dvdx_local;
  float dudx_local;
  
  fVar2 = deFloatAbs(dudx);
  fVar3 = deFloatAbs(dudy);
  fVar2 = de::max<float>(fVar2,fVar3);
  fVar3 = deFloatAbs(dvdx);
  fVar4 = deFloatAbs(dvdy);
  fVar3 = de::max<float>(fVar3,fVar4);
  fVar4 = deFloatAbs(dwdx);
  fVar5 = deFloatAbs(dwdy);
  fVar5 = de::max<float>(fVar4,fVar5);
  fVar4 = de::max<float>(fVar2,fVar3);
  fVar4 = de::max<float>(fVar4,fVar5);
  fVar5 = fVar2 + fVar3 + fVar5;
  fVar2 = TexVerifierUtil::computeFloatingPointError(fVar4,prec->derivateBits);
  fVar3 = TexVerifierUtil::computeFloatingPointError(fVar5,prec->derivateBits);
  fVar2 = deFloatLog2(fVar4 - fVar2);
  fVar3 = deFloatLog2(fVar5 + fVar3);
  fVar4 = TexVerifierUtil::computeFixedPointError(prec->lodBits);
  Vector<float,_2>::Vector((Vector<float,_2> *)this,fVar2 - fVar4,fVar3 + fVar4);
  VVar1.m_data[1] = extraout_XMM0_Db;
  VVar1.m_data[0] = extraout_XMM0_Da;
  return (Vec2)VVar1.m_data;
}

Assistant:

Vec2 computeOpenGLLodBoundsFromDerivates (const float dudx, const float dvdx, const float dwdx, const float dudy, const float dvdy, const float dwdy, const LodPrecision& prec)
{
	const float		mu			= de::max(deFloatAbs(dudx), deFloatAbs(dudy));
	const float		mv			= de::max(deFloatAbs(dvdx), deFloatAbs(dvdy));
	const float		mw			= de::max(deFloatAbs(dwdx), deFloatAbs(dwdy));
	const float		minDBound	= de::max(de::max(mu, mv), mw);
	const float		maxDBound	= mu + mv + mw;
	const float		minDErr		= computeFloatingPointError(minDBound, prec.derivateBits);
	const float		maxDErr		= computeFloatingPointError(maxDBound, prec.derivateBits);
	const float		minLod		= deFloatLog2(minDBound-minDErr);
	const float		maxLod		= deFloatLog2(maxDBound+maxDErr);
	const float		lodErr		= computeFixedPointError(prec.lodBits);

	DE_ASSERT(minLod <= maxLod);
	return Vec2(minLod-lodErr, maxLod+lodErr);
}